

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.h
# Opt level: O1

uint __thiscall BitStreamReader::getBits(BitStreamReader *this,uint num)

{
  uint uVar1;
  undefined8 *puVar2;
  int iVar3;
  uint *buff;
  
  if ((num < 0x21) && (num <= (this->super_BitStream).m_totalBits)) {
    uVar1 = this->m_bitLeft;
    if (uVar1 < num) {
      if ((ulong)uVar1 == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = (BitStream::m_masks[uVar1] & this->m_curVal) << ((char)num - (char)uVar1 & 0x1fU);
      }
      buff = (this->super_BitStream).m_buffer + 1;
      (this->super_BitStream).m_buffer = buff;
      uVar1 = getCurVal(this,buff);
      this->m_curVal = uVar1;
      uVar1 = (this->m_bitLeft - num) + 0x20;
    }
    else {
      uVar1 = uVar1 - num;
      iVar3 = 0;
    }
    this->m_bitLeft = uVar1;
    (this->super_BitStream).m_totalBits = (this->super_BitStream).m_totalBits - num;
    return (this->m_curVal >> ((byte)uVar1 & 0x1f)) + iVar3 & BitStream::m_masks[num];
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_0023f8a8;
  __cxa_throw(puVar2,&BitStreamException::typeinfo,std::exception::~exception);
}

Assistant:

[[nodiscard]] unsigned getBits(const unsigned num)
    {
        if (num > INT_BIT || m_totalBits < num)
            THROW_BITSTREAM_ERR;
        unsigned prevVal = 0;
        if (num <= m_bitLeft)
            m_bitLeft -= num;
        else
        {
            if (m_bitLeft != 0)
                prevVal = (m_curVal & m_masks[m_bitLeft]) << (num - m_bitLeft);
            m_buffer++;
            m_curVal = getCurVal(m_buffer);
            m_bitLeft += INT_BIT - num;
        }
        m_totalBits -= num;
        return prevVal + (m_curVal >> m_bitLeft) & m_masks[num];
    }